

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_counted_base_gcc_x86.hpp
# Opt level: O0

void boost::detail::atomic_increment(int *pw)

{
  int *pw_local;
  
  LOCK();
  *pw = *pw + 1;
  UNLOCK();
  return;
}

Assistant:

inline void atomic_increment( int * pw )
{
    //atomic_exchange_and_add( pw, 1 );

    __asm__
    (
        "lock\n\t"
        "incl %0":
        "=m"( *pw ): // output (%0)
        "m"( *pw ): // input (%1)
        "cc" // clobbers
    );
}